

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Sector_SetDamage(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                       int arg4)

{
  FName local_38;
  int local_34;
  int secnum;
  FSectorTagIterator itr;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  itr.searchtag = arg2;
  itr.start = arg1;
  FSectorTagIterator::FSectorTagIterator((FSectorTagIterator *)&stack0xffffffffffffffd0,arg0);
  while (local_34 = FSectorTagIterator::Next((FSectorTagIterator *)&stack0xffffffffffffffd0),
        -1 < local_34) {
    if (arg3 < 1) {
      if (itr.start < 0x14) {
        arg4 = 0;
        arg3 = 0x20;
      }
      else if (itr.start < 0x32) {
        arg4 = 5;
        arg3 = 0x20;
      }
      else {
        arg4 = 0x100;
        arg3 = 1;
      }
    }
    sectors[local_34].damageamount = (int)(short)itr.start;
    MODtoDamageType((int)&local_38);
    FNameNoInit::operator=(&sectors[local_34].damagetype,&local_38);
    sectors[local_34].damageinterval = (short)arg3;
    sectors[local_34].leakydamage = (short)arg4;
  }
  return 1;
}

Assistant:

FUNC(LS_Sector_SetDamage)
// Sector_SetDamage (tag, amount, mod, interval, leaky)
{
	// The sector still stores the mod in its old format because
	// adding an FName to the sector_t structure might cause
	// problems by adding an unwanted constructor.
	// Since it doesn't really matter whether the type is translated
	// here or in P_PlayerInSpecialSector I think it's the best solution.
	FSectorTagIterator itr(arg0);
	int secnum;
	while ((secnum = itr.Next()) >= 0)
	{
		if (arg3 <= 0)	// emulate old and hacky method to handle leakiness.
		{
			if (arg1 < 20)
			{
				arg4 = 0;
				arg3 = 32;
			}
			else if (arg1 < 50)
			{
				arg4 = 5;
				arg3 = 32;
			}
			else
			{
				arg4 = 256;
				arg3 = 1;
			}
		}
		sectors[secnum].damageamount = (short)arg1;
		sectors[secnum].damagetype = MODtoDamageType(arg2);
		sectors[secnum].damageinterval = (short)arg3;
		sectors[secnum].leakydamage = (short)arg4;
	}
	return true;
}